

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setDateRange(QDateTimeEdit *this,QDate min,QDate max)

{
  long lVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  QDateTime aQStack_48 [8];
  QDateTime local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (max.jd + 0xb69eeff91fU < 0x16d3e147974 && min.jd + 0xb69eeff91fU < 0x16d3e147974) {
    lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    uVar2 = ::QVariant::toTime();
    lVar1 = lVar1 + 0x508;
    QDateTime::QDateTime(local_40,min.jd,uVar2,lVar1,1);
    uVar2 = ::QVariant::toTime();
    QDateTime::QDateTime(aQStack_48,max.jd,uVar2,lVar1,1);
    setDateTimeRange(this,local_40,aQStack_48);
    QDateTime::~QDateTime(aQStack_48);
    QDateTime::~QDateTime(local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDateRange(QDate min, QDate max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(min, d->minimum.toTime()),
                         d->dateTimeValue(max, d->maximum.toTime()));
    }
}